

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

uint32_t EthBasePort::BitReverse32(uint32_t input)

{
  return (uint)""[input >> 0x10 & 0xff] << 8 |
         (uint)""[input >> 8 & 0xff] << 0x10 | (uint)""[input & 0xff] << 0x18 |
         (uint)""[input >> 0x18];
}

Assistant:

uint32_t EthBasePort::BitReverse32(uint32_t input)
{
    unsigned char inputs[4];
    inputs[0] = BitReverseTable[input & 0x000000ff];
    inputs[1] = BitReverseTable[(input & 0x0000ff00)>>8];
    inputs[2] = BitReverseTable[(input & 0x00ff0000)>>16];
    inputs[3] = BitReverseTable[(input & 0xff000000)>>24];
    uint32_t output = 0x00000000;
    output |= (uint32_t)inputs[0] << 24;
    output |= (uint32_t)inputs[1] << 16;
    output |= (uint32_t)inputs[2] << 8;
    output |= (uint32_t)inputs[3];
    return output;
}